

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trapezoidal_decomposition.cc
# Opt level: O2

void __thiscall
PolygonTriangulation::add_segment_to_query_structure
          (PolygonTriangulation *this,uint32_t segment_index)

{
  uint32_t max_y_index;
  uint32_t min_y_index;
  uint32_t local_30;
  uint32_t local_2c;
  
  get_max_min_y_indices
            (this,(this->segments_).super__Vector_base<segment_t,_std::allocator<segment_t>_>.
                  _M_impl.super__Vector_impl_data._M_start + segment_index,&local_30,&local_2c);
  add_endpoint_to_query_structure(this,local_30);
  add_endpoint_to_query_structure(this,local_2c);
  thread_endpoints(this,segment_index,local_30,local_2c);
  return;
}

Assistant:

void PolygonTriangulation::add_segment_to_query_structure(const uint32_t segment_index)
{
  const auto &segment = segments_[segment_index];

  uint32_t min_y_index, max_y_index;
  get_max_min_y_indices(segment, max_y_index, min_y_index);

  add_endpoint_to_query_structure(max_y_index);
  add_endpoint_to_query_structure(min_y_index);
  thread_endpoints(segment_index, max_y_index, min_y_index);
}